

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O2

void __thiscall fasttext::Matrix::load(Matrix *this,istream *in)

{
  real *prVar1;
  ulong uVar2;
  
  std::istream::read((char *)in,(long)&this->m_);
  std::istream::read((char *)in,(long)&this->n_);
  if (this->data_ != (real *)0x0) {
    operator_delete__(this->data_);
  }
  uVar2 = this->n_ * this->m_;
  prVar1 = (real *)operator_new__(-(ulong)(uVar2 >> 0x3e != 0) | uVar2 * 4);
  this->data_ = prVar1;
  std::istream::read((char *)in,(long)prVar1);
  return;
}

Assistant:

void Matrix::load(std::istream& in) {
  in.read((char*) &m_, sizeof(int64_t));
  in.read((char*) &n_, sizeof(int64_t));
  delete[] data_;
  data_ = new real[m_ * n_];
  in.read((char*) data_, m_ * n_ * sizeof(real));
}